

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXExporter::WriteBinaryFooter(FBXExporter *this)

{
  uint uVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong local_90;
  size_t i_2;
  shared_ptr<Assimp::IOStream> local_78;
  undefined1 local_68 [8];
  StreamWriterLE outstream;
  size_t i_1;
  size_t i;
  size_t pad;
  size_t pos;
  FBXExporter *this_local;
  
  peVar2 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->outfile);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::size();
  (*peVar2->_vptr_IOStream[3])(peVar2,uVar3,uVar4,1);
  peVar2 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->outfile);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::size();
  (*peVar2->_vptr_IOStream[3])(peVar2,uVar3,uVar4,1);
  peVar2 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->outfile);
  uVar1 = (*peVar2->_vptr_IOStream[5])();
  for (i_1 = 0; i_1 < 0x10 - ((ulong)uVar1 & 0xf); i_1 = i_1 + 1) {
    peVar2 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->outfile);
    (*peVar2->_vptr_IOStream[3])(peVar2,"",1);
  }
  for (outstream.cursor = 0; outstream.cursor < 4; outstream.cursor = outstream.cursor + 1) {
    peVar2 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->outfile);
    (*peVar2->_vptr_IOStream[3])(peVar2,"",1);
  }
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&local_78,&this->outfile);
  StreamWriter<false,_false>::StreamWriter((StreamWriter<false,_false> *)local_68,&local_78,false);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_78);
  StreamWriter<false,_false>::PutU4((StreamWriter<false,_false> *)local_68,0x1d4c);
  StreamWriter<false,_false>::~StreamWriter((StreamWriter<false,_false> *)local_68);
  for (local_90 = 0; local_90 < 0x78; local_90 = local_90 + 1) {
    peVar2 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->outfile);
    (*peVar2->_vptr_IOStream[3])(peVar2,"",1);
  }
  peVar2 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->outfile);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::size();
  (*peVar2->_vptr_IOStream[3])(peVar2,uVar3,uVar4,1);
  return;
}

Assistant:

void FBXExporter::WriteBinaryFooter()
{
    outfile->Write(NULL_RECORD.c_str(), NULL_RECORD.size(), 1);

    outfile->Write(GENERIC_FOOTID.c_str(), GENERIC_FOOTID.size(), 1);

    // here some padding is added for alignment to 16 bytes.
    // if already aligned, the full 16 bytes is added.
    size_t pos = outfile->Tell();
    size_t pad = 16 - (pos % 16);
    for (size_t i = 0; i < pad; ++i) {
        outfile->Write("\x00", 1, 1);
    }

    // not sure what this is, but it seems to always be 0 in modern files
    for (size_t i = 0; i < 4; ++i) {
        outfile->Write("\x00", 1, 1);
    }

    // now the file version again
    {
        StreamWriterLE outstream(outfile);
        outstream.PutU4(EXPORT_VERSION_INT);
    } // StreamWriter destructor writes the data to the file

    // and finally some binary footer added to all files
    for (size_t i = 0; i < 120; ++i) {
        outfile->Write("\x00", 1, 1);
    }
    outfile->Write(FOOT_MAGIC.c_str(), FOOT_MAGIC.size(), 1);
}